

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          char (*ts) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,
          char (*ts_2) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,
          char (*ts_4) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,
          char (*ts_6) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,
          char (*ts_8) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_9,
          char (*ts_10) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_11
          ,char (*ts_12) [3])

{
  StringStream<4096UL,_4096UL> *this_00;
  size_t sVar1;
  
  this_00 = &this->buffer;
  StringStream<4096UL,_4096UL>::append(this_00,(t->_M_dataplus)._M_p,t->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts);
  StringStream<4096UL,_4096UL>::append(this_00,*ts,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts_1->_M_dataplus)._M_p,ts_1->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_2);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_2,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts_3->_M_dataplus)._M_p,ts_3->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_4);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_4,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts_5->_M_dataplus)._M_p,ts_5->_M_string_length);
  this->statement_count = this->statement_count + 1;
  statement_inner<char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
            (this,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11,ts_12);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}